

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O2

int CommandLineRPC(int argc,char **argv)

{
  VType VVar1;
  long lVar2;
  pointer pUVar3;
  string str;
  string key;
  string key_00;
  string str_00;
  UniValue val;
  UniValue val_00;
  array<std::array<unsigned_short,_8UL>,_3UL> *paVar4;
  array<unsigned_short,_8UL> *paVar5;
  bool bVar6;
  int iVar7;
  istream *piVar8;
  NetinfoRequestHandler *this;
  reference pvVar9;
  UniValue *pUVar10;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar11;
  string *psVar12;
  UniValue *pUVar13;
  UniValue *pUVar14;
  iterator iVar15;
  mapped_type *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  ulong uVar17;
  runtime_error *prVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  _Rb_tree_node_base *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  string *proxy_1;
  pointer pbVar20;
  int i;
  int iVar21;
  ostream *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string *wallet;
  pointer pbVar23;
  pointer pUVar24;
  long in_FS_OFFSET;
  double dVar25;
  double dVar26;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  undefined8 in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  pointer in_stack_fffffffffffffb48;
  undefined8 in_stack_fffffffffffffb50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int local_48c;
  undefined8 uStack_488;
  UniValue result;
  DefaultRequestHandler rh;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  wallet_name_1;
  string walletPass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string method;
  string rpcPass;
  string strPrint;
  string BLUE;
  string YELLOW;
  NoechoInst _no_echo_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [4];
  NoechoInst _no_echo;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [4];
  size_t max_balance_length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  formatted_proxies;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ordered_proxies;
  string local_118;
  _Rb_tree_node_base local_f8;
  DefaultRequestHandler rh_1;
  size_type local_d0;
  string ibd_progress_bar;
  string result_string;
  string CYAN;
  string MAGENTA;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  strPrint._M_dataplus._M_p = (pointer)&strPrint.field_2;
  strPrint._M_string_length = 0;
  local_48c = 0;
  strPrint.field_2._M_local_buf[0] = '\0';
  iVar7 = 1;
  if (argc < 1) {
    iVar7 = argc;
  }
  while ((argv = argv + 1, iVar21 = iVar7, 1 < argc && (iVar21 = argc, **argv == '-'))) {
    argc = argc + -1;
  }
  rpcPass._M_dataplus._M_p = (pointer)&rpcPass.field_2;
  rpcPass._M_string_length = 0;
  rpcPass.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&walletPass,"-stdinrpcpass",(allocator<char> *)&_no_echo);
  bVar6 = ArgsManager::GetBoolArg(&gArgs,&walletPass,false);
  std::__cxx11::string::~string((string *)&walletPass);
  if (bVar6) {
    NoechoInst::NoechoInst(&_no_echo);
    bVar6 = StdinReady();
    if (!bVar6) {
      fputs("RPC password> ",_stderr);
      fflush(_stderr);
    }
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&rpcPass);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar18,"-stdinrpcpass specified but failed to read from standard input");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0011737b;
    }
    bVar6 = StdinTerminal();
    if (bVar6) {
      fputc(10,_stdout);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&walletPass,"-rpcpassword",(allocator<char> *)&_no_echo_1);
    ArgsManager::ForceSetArg(&gArgs,&walletPass,&rpcPass);
    std::__cxx11::string::~string((string *)&walletPass);
    NoechoInst::~NoechoInst(&_no_echo);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,argv,
             argv + (long)iVar21 + -1,(allocator_type *)&walletPass);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&walletPass,"-stdinwalletpassphrase",(allocator<char> *)&_no_echo);
  bVar6 = ArgsManager::GetBoolArg(&gArgs,&walletPass,false);
  std::__cxx11::string::~string((string *)&walletPass);
  if (bVar6) {
    NoechoInst::NoechoInst(&_no_echo_1);
    walletPass._M_dataplus._M_p = (pointer)&walletPass.field_2;
    walletPass._M_string_length = 0;
    walletPass.field_2._M_allocated_capacity =
         walletPass.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
LAB_00116458:
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar18,"-stdinwalletpassphrase is only applicable for walletpassphrase(change)");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_no_echo,
                 args.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0,0x10);
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &_no_echo,"walletpassphrase");
      std::__cxx11::string::~string((string *)&_no_echo);
      if (!bVar6) goto LAB_00116458;
      bVar6 = StdinReady();
      if (!bVar6) {
        fputs("Wallet passphrase> ",_stderr);
        fflush(_stderr);
      }
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,(string *)&walletPass);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
        bVar6 = StdinTerminal();
        if (bVar6) {
          fputc(10,_stdout);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&args,args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,&walletPass);
        std::__cxx11::string::~string((string *)&walletPass);
        NoechoInst::~NoechoInst(&_no_echo_1);
        goto LAB_001143e3;
      }
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar18,"-stdinwalletpassphrase specified but failed to read from standard input");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0011737b;
  }
LAB_001143e3:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&walletPass,"-stdin",(allocator<char> *)&_no_echo);
  bVar6 = ArgsManager::GetBoolArg(&gArgs,&walletPass,false);
  std::__cxx11::string::~string((string *)&walletPass);
  if (bVar6) {
    walletPass._M_dataplus._M_p = (pointer)&walletPass.field_2;
    walletPass._M_string_length = 0;
    walletPass.field_2._M_allocated_capacity =
         walletPass.field_2._M_allocated_capacity & 0xffffffffffffff00;
    while (piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&std::cin,(string *)&walletPass),
          ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args,&walletPass);
    }
    bVar6 = StdinTerminal();
    if (bVar6) {
      fputc(10,_stdout);
    }
    std::__cxx11::string::~string((string *)&walletPass);
  }
  ArgsManager::CheckMultipleCLIArgs(&gArgs);
  method._M_dataplus._M_p = (pointer)&method.field_2;
  method._M_string_length = 0;
  method.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&walletPass,"-getinfo",(allocator<char> *)&_no_echo);
  bVar6 = ArgsManager::IsArgSet(&gArgs,&walletPass);
  std::__cxx11::string::~string((string *)&walletPass);
  if (bVar6) {
    this = (NetinfoRequestHandler *)operator_new(0x18);
    (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
         (_func_int **)&PTR__BaseRequestHandler_001d4710;
    (this->m_counts)._M_elems[0]._M_elems[0] = 0;
    (this->m_counts)._M_elems[0]._M_elems[1] = 0;
    (this->m_counts)._M_elems[0]._M_elems[2] = 1;
    (this->m_counts)._M_elems[0]._M_elems[3] = 0;
    paVar4 = &this->m_counts;
    paVar4->_M_elems[0]._M_elems[4] = 2;
    paVar4->_M_elems[0]._M_elems[5] = 0;
    paVar4->_M_elems[0]._M_elems[6] = 3;
    paVar4->_M_elems[0]._M_elems[7] = 0;
LAB_00114a7e:
    if (local_48c == 0) {
      wallet_name_1.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&walletPass,"-rpcwallet",(allocator<char> *)&_no_echo);
      bVar6 = ArgsManager::IsArgSet(&gArgs,&walletPass);
      std::__cxx11::string::~string((string *)&walletPass);
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&_no_echo,"-rpcwallet",(allocator<char> *)&BLUE);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&_no_echo_1,"",(allocator<char> *)&rh);
        ArgsManager::GetArg(&walletPass,&gArgs,(string *)&_no_echo,(string *)&_no_echo_1);
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)&wallet_name_1,&walletPass);
        std::__cxx11::string::~string((string *)&walletPass);
        std::__cxx11::string::~string((string *)&_no_echo_1);
        std::__cxx11::string::~string((string *)&_no_echo);
      }
      ConnectAndCallRPC((UniValue *)&rh,&this->super_BaseRequestHandler,&method,&args,&wallet_name_1
                       );
      key_03._M_str = "result";
      key_03._M_len = 6;
      pUVar10 = UniValue::find_value((UniValue *)&rh,key_03);
      UniValue::UniValue(&result,pUVar10);
      key_04._M_str = "error";
      key_04._M_len = 5;
      pUVar10 = UniValue::find_value((UniValue *)&rh,key_04);
      if (pUVar10->typ == VNULL) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&walletPass,"-getinfo",(allocator<char> *)&_no_echo);
        bVar6 = ArgsManager::GetBoolArg(&gArgs,&walletPass,false);
        std::__cxx11::string::~string((string *)&walletPass);
        if (bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&walletPass,"-rpcwallet",(allocator<char> *)&_no_echo);
          bVar6 = ArgsManager::IsArgSet(&gArgs,&walletPass);
          std::__cxx11::string::~string((string *)&walletPass);
          if (!bVar6) {
            rh_1.super_BaseRequestHandler._vptr_BaseRequestHandler =
                 (BaseRequestHandler)&PTR__BaseRequestHandler_001d48c8;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&_no_echo_1,"listwallets",(allocator<char> *)&YELLOW);
            BLUE.field_2._M_allocated_capacity = 0;
            BLUE._M_dataplus._M_p = (pointer)0x0;
            BLUE._M_string_length = 0;
            local_1c0[1]._M_local_buf[0] = false;
            ConnectAndCallRPC((UniValue *)&walletPass,&rh_1.super_BaseRequestHandler,
                              (string *)&_no_echo_1,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&BLUE,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&_no_echo);
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&_no_echo);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&BLUE);
            std::__cxx11::string::~string((string *)&_no_echo_1);
            key_05._M_str = "error";
            key_05._M_len = 5;
            pUVar10 = UniValue::find_value((UniValue *)&walletPass,key_05);
            if ((pUVar10->typ == VNULL) &&
               (key_06._M_str = "result", key_06._M_len = 6,
               pUVar10 = UniValue::find_value((UniValue *)&walletPass,key_06),
               1 < (ulong)(((long)(pUVar10->values).
                                  super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(pUVar10->values).
                                 super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                 super__Vector_impl_data._M_start) / 0x58))) {
              MAGENTA._M_dataplus._M_p = (pointer)&MAGENTA.field_2;
              MAGENTA._M_string_length = 0;
              MAGENTA.field_2._M_local_buf[0] = '\0';
              str._M_string_length = (size_type)this;
              str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb38;
              str.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb48;
              str.field_2._8_8_ = in_stack_fffffffffffffb50;
              UniValue::UniValue((UniValue *)&_no_echo,VOBJ,str);
              std::__cxx11::string::~string((string *)&MAGENTA);
              pvVar11 = UniValue::getValues(pUVar10);
              in_stack_fffffffffffffb48 =
                   (pvVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              for (pUVar24 = (pvVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                  pUVar24 != in_stack_fffffffffffffb48; pUVar24 = pUVar24 + 1) {
                psVar12 = UniValue::get_str_abi_cxx11_(pUVar24);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&CYAN,"getbalances",(allocator<char> *)&local_f8);
                ibd_progress_bar._M_dataplus._M_p = (pointer)0x0;
                ibd_progress_bar._M_string_length = 0;
                ibd_progress_bar.field_2._M_allocated_capacity = 0;
                std::_Optional_payload_base<std::__cxx11::string>::
                _Optional_payload_base<std::__cxx11::string_const&>
                          ((_Optional_payload_base<std::__cxx11::string> *)&YELLOW,psVar12);
                ConnectAndCallRPC((UniValue *)&_no_echo_1,&rh_1.super_BaseRequestHandler,&CYAN,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&ibd_progress_bar,
                                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&YELLOW);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&YELLOW);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ibd_progress_bar);
                std::__cxx11::string::~string((string *)&CYAN);
                key_07._M_str = "result";
                key_07._M_len = 6;
                pUVar10 = UniValue::find_value((UniValue *)&_no_echo_1,key_07);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&YELLOW,"mine",(allocator<char> *)&ibd_progress_bar);
                pUVar10 = UniValue::operator[](pUVar10,&YELLOW);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&CYAN,"trusted",(allocator<char> *)&local_f8);
                pUVar10 = UniValue::operator[](pUVar10,&CYAN);
                std::__cxx11::string::~string((string *)&CYAN);
                std::__cxx11::string::~string((string *)&YELLOW);
                std::__cxx11::string::string((string *)&result_string,psVar12);
                UniValue::UniValue((UniValue *)&BLUE,pUVar10);
                key._M_string_length = (size_type)this;
                key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb38;
                key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb48;
                key.field_2._8_8_ = in_stack_fffffffffffffb50;
                val.val._M_dataplus._M_p =
                     (pointer)args.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                val._0_8_ = args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                val.val._8_12_ = stack0xfffffffffffffb68;
                val.val.field_2._M_allocated_capacity._4_4_ = local_48c;
                val.val.field_2._8_8_ = uStack_488;
                val.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ = result.typ;
                val._44_44_ = result._4_44_;
                UniValue::pushKV((UniValue *)&_no_echo,key,val);
                UniValue::~UniValue((UniValue *)&BLUE);
                std::__cxx11::string::~string((string *)&result_string);
                UniValue::~UniValue((UniValue *)&_no_echo_1);
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&YELLOW,"balances",(allocator<char> *)&CYAN);
              UniValue::UniValue((UniValue *)&_no_echo_1,(UniValue *)&_no_echo);
              key_00._M_string_length = (size_type)this;
              key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb38;
              key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb48;
              key_00.field_2._8_8_ = in_stack_fffffffffffffb50;
              val_00.val._M_dataplus._M_p =
                   (pointer)args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              val_00._0_8_ = args.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              val_00.val._8_12_ = stack0xfffffffffffffb68;
              val_00.val.field_2._M_allocated_capacity._4_4_ = local_48c;
              val_00.val.field_2._8_8_ = uStack_488;
              val_00.keys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = result.typ;
              val_00._44_44_ = result._4_44_;
              UniValue::pushKV(&result,key_00,val_00);
              UniValue::~UniValue((UniValue *)&_no_echo_1);
              std::__cxx11::string::~string((string *)&YELLOW);
              UniValue::~UniValue((UniValue *)&_no_echo);
            }
            UniValue::~UniValue((UniValue *)&walletPass);
          }
          key_08._M_str = "error";
          key_08._M_len = 5;
          pUVar10 = UniValue::find_value(&result,key_08);
          if (pUVar10->typ == VNULL) {
            __no_echo = local_1c0;
            __no_echo_1 = (pointer)local_218;
            local_1c0[0]._M_local_buf[0] = '\0';
            local_218[0]._M_local_buf[0] = '\0';
            BLUE._M_dataplus._M_p = (pointer)&BLUE.field_2;
            BLUE._M_string_length = 0;
            YELLOW._M_dataplus._M_p = (pointer)&YELLOW.field_2;
            YELLOW._M_string_length = 0;
            BLUE.field_2._M_allocated_capacity =
                 BLUE.field_2._M_allocated_capacity & 0xffffffffffffff00;
            YELLOW.field_2._M_local_buf[0] = '\0';
            MAGENTA._M_dataplus._M_p = (pointer)&MAGENTA.field_2;
            MAGENTA._M_string_length = 0;
            CYAN._M_dataplus._M_p = (pointer)&CYAN.field_2;
            CYAN._M_string_length = 0;
            MAGENTA.field_2._M_local_buf[0] = '\0';
            CYAN.field_2._M_local_buf[0] = '\0';
            iVar7 = fileno(_stdout);
            iVar7 = isatty(iVar7);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&walletPass,"-color",(allocator<char> *)&result_string);
            bVar6 = ArgsManager::IsArgSet(&gArgs,&walletPass);
            std::__cxx11::string::~string((string *)&walletPass);
            if (bVar6) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result_string,"-color",(allocator<char> *)&ibd_progress_bar);
              ArgsManager::GetArg(&walletPass,&gArgs,&result_string,
                                  &DEFAULT_COLOR_SETTING_abi_cxx11_);
              std::__cxx11::string::~string((string *)&result_string);
              bVar6 = std::operator==(&walletPass,"always");
              if (bVar6) {
                std::__cxx11::string::~string((string *)&walletPass);
                goto LAB_00115161;
              }
              bVar6 = std::operator==(&walletPass,"never");
              if (!bVar6) {
                bVar6 = std::operator==(&walletPass,"auto");
                if (!bVar6) {
                  prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar18,
                             "Invalid value for -color option. Valid values: always, auto, never.");
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                    __cxa_throw(prVar18,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  goto LAB_0011737b;
                }
                std::__cxx11::string::~string((string *)&walletPass);
                goto LAB_0011515d;
              }
              std::__cxx11::string::~string((string *)&walletPass);
            }
            else {
LAB_0011515d:
              if (iVar7 != 0) {
LAB_00115161:
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &_no_echo,"\x1b[0m");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &_no_echo_1,"\x1b[32m");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                assign(&BLUE,"\x1b[34m");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                assign(&YELLOW,"\x1b[33m");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                assign(&MAGENTA,"\x1b[35m");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                assign(&CYAN,"\x1b[36m");
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&walletPass,"chain",(allocator<char> *)&ibd_progress_bar);
            pUVar10 = UniValue::operator[](&result,&walletPass);
            pbVar19 = &pUVar10->val;
            args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_no_echo;
            pbVar22 = args_1;
            tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (&result_string,(tinyformat *)"%sChain: %s%s\n",(char *)&BLUE,pbVar19,args_1,
                       in_R9);
            std::__cxx11::string::~string((string *)&walletPass);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ibd_progress_bar,"blocks",(allocator<char> *)&rh_1);
            pUVar10 = UniValue::operator[](&result,&ibd_progress_bar);
            tinyformat::format<std::__cxx11::string>
                      (&walletPass,(tinyformat *)"Blocks: %s\n",(char *)&pUVar10->val,pbVar19);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,&walletPass);
            std::__cxx11::string::~string((string *)&walletPass);
            std::__cxx11::string::~string((string *)&ibd_progress_bar);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ibd_progress_bar,"headers",(allocator<char> *)&rh_1);
            pUVar10 = UniValue::operator[](&result,&ibd_progress_bar);
            tinyformat::format<std::__cxx11::string>
                      (&walletPass,(tinyformat *)"Headers: %s\n",(char *)&pUVar10->val,pbVar19);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,&walletPass);
            std::__cxx11::string::~string((string *)&walletPass);
            std::__cxx11::string::~string((string *)&ibd_progress_bar);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&walletPass,"verificationprogress",
                       (allocator<char> *)&ibd_progress_bar);
            pUVar10 = UniValue::operator[](&result,&walletPass);
            dVar25 = UniValue::get_real(pUVar10);
            std::__cxx11::string::~string((string *)&walletPass);
            ibd_progress_bar._M_dataplus._M_p = (pointer)&ibd_progress_bar.field_2;
            ibd_progress_bar._M_string_length = 0;
            ibd_progress_bar.field_2._M_allocated_capacity =
                 ibd_progress_bar.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if (dVar25 < 0.99) {
              if ((0.0 <= dVar25) && (dVar25 <= 1.0)) {
                if ((GetProgressBar(double,std::__cxx11::string&)::COMPLETE_BAR_abi_cxx11_ == '\0')
                   && (iVar7 = __cxa_guard_acquire(&GetProgressBar(double,std::__cxx11::string&)::
                                                    COMPLETE_BAR_abi_cxx11_), iVar7 != 0)) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)
                             GetProgressBar(double,std::__cxx11::string&)::COMPLETE_BAR_abi_cxx11_,
                             anon_var_dwarf_14c11,(allocator<char> *)&walletPass);
                  __cxa_atexit(std::__cxx11::string::~string,
                               GetProgressBar(double,std::__cxx11::string&)::COMPLETE_BAR_abi_cxx11_
                               ,&__dso_handle);
                  __cxa_guard_release(&GetProgressBar(double,std::__cxx11::string&)::
                                       COMPLETE_BAR_abi_cxx11_);
                }
                if ((GetProgressBar(double,std::__cxx11::string&)::INCOMPLETE_BAR_abi_cxx11_ == '\0'
                    ) && (iVar7 = __cxa_guard_acquire(&GetProgressBar(double,std::__cxx11::string&)
                                                       ::INCOMPLETE_BAR_abi_cxx11_), iVar7 != 0)) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)
                             GetProgressBar(double,std::__cxx11::string&)::INCOMPLETE_BAR_abi_cxx11_
                             ,anon_var_dwarf_14c1e,(allocator<char> *)&walletPass);
                  __cxa_atexit(std::__cxx11::string::~string,
                               GetProgressBar(double,std::__cxx11::string&)::
                               INCOMPLETE_BAR_abi_cxx11_,&__dso_handle);
                  __cxa_guard_release(&GetProgressBar(double,std::__cxx11::string&)::
                                       INCOMPLETE_BAR_abi_cxx11_);
                }
                dVar26 = dVar25 / 0.05;
                for (iVar7 = 0; (double)iVar7 < dVar26; iVar7 = iVar7 + 1) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&ibd_progress_bar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         GetProgressBar(double,std::__cxx11::string&)::COMPLETE_BAR_abi_cxx11_);
                }
                in_stack_fffffffffffffb48 = (pointer)((1.0 - dVar25) / 0.05);
                for (iVar7 = 0; (double)iVar7 < (double)in_stack_fffffffffffffb48; iVar7 = iVar7 + 1
                    ) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&ibd_progress_bar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         GetProgressBar(double,std::__cxx11::string&)::INCOMPLETE_BAR_abi_cxx11_);
                }
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&ibd_progress_bar," ");
            }
            rh_1.super_BaseRequestHandler._vptr_BaseRequestHandler =
                 (BaseRequestHandler)(dVar25 * 100.0);
            pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh_1;
            tinyformat::format<std::__cxx11::string,double>
                      (&walletPass,(tinyformat *)"Verification progress: %s%.4f%%\n",
                       (char *)&ibd_progress_bar,pbVar19,(double *)pbVar22);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,&walletPass);
            std::__cxx11::string::~string((string *)&walletPass);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rh_1,"difficulty",(allocator<char> *)&local_f8);
            pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
            tinyformat::format<std::__cxx11::string>
                      (&walletPass,(tinyformat *)"Difficulty: %s\n\n",(char *)&pUVar10->val,pbVar19)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,&walletPass);
            std::__cxx11::string::~string((string *)&walletPass);
            std::__cxx11::string::~string((string *)&rh_1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rh_1,"connections",(allocator<char> *)((long)&uStack_488 + 7));
            pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,"in",(allocator<char> *)((long)&uStack_488 + 6));
            pUVar10 = UniValue::operator[](pUVar10,(string *)&local_f8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_118,"connections",(allocator<char> *)((long)&uStack_488 + 5)
                      );
            pUVar13 = UniValue::operator[](&result,&local_118);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ordered_proxies,"out",(allocator<char> *)((long)&uStack_488 + 4));
            pUVar13 = UniValue::operator[](pUVar13,(string *)&ordered_proxies);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&formatted_proxies,"connections",
                       (allocator<char> *)((long)&uStack_488 + 3));
            pUVar14 = UniValue::operator[](&result,(string *)&formatted_proxies);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&max_balance_length,"total",
                       (allocator<char> *)((long)&uStack_488 + 2));
            pUVar14 = UniValue::operator[](pUVar14,(string *)&max_balance_length);
            args_00 = (_Rb_tree_node_base *)&pUVar10->val;
            pbVar22 = &pUVar13->val;
            pbVar19 = &pUVar14->val;
            tinyformat::
            format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (&walletPass,(tinyformat *)"%sNetwork: in %s, out %s, total %s%s\n",
                       (char *)&_no_echo_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00,
                       pbVar22,pbVar19,args_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,&walletPass);
            std::__cxx11::string::~string((string *)&walletPass);
            std::__cxx11::string::~string((string *)&max_balance_length);
            std::__cxx11::string::~string((string *)&formatted_proxies);
            std::__cxx11::string::~string((string *)&ordered_proxies);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&rh_1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rh_1,"version",(allocator<char> *)&local_f8);
            pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
            tinyformat::format<std::__cxx11::string>
                      (&walletPass,(tinyformat *)"Version: %s\n",(char *)&pUVar10->val,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,&walletPass);
            std::__cxx11::string::~string((string *)&walletPass);
            std::__cxx11::string::~string((string *)&rh_1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rh_1,"timeoffset",(allocator<char> *)&local_f8);
            pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
            tinyformat::format<std::__cxx11::string>
                      (&walletPass,(tinyformat *)"Time offset (s): %s\n",(char *)&pUVar10->val,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,&walletPass);
            std::__cxx11::string::~string((string *)&walletPass);
            std::__cxx11::string::~string((string *)&rh_1);
            walletPass.field_2._8_8_ = &walletPass._M_string_length;
            walletPass._M_string_length = walletPass._M_string_length & 0xffffffff00000000;
            walletPass.field_2._M_allocated_capacity = 0;
            ordered_proxies.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ordered_proxies.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ordered_proxies.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rh_1,"networks",(allocator<char> *)&local_f8);
            pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
            pvVar11 = UniValue::getValues(pUVar10);
            std::__cxx11::string::~string((string *)&rh_1);
            pUVar3 = (pvVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pUVar24 = (pvVar11->super__Vector_base<UniValue,_std::allocator<UniValue>_>).
                           _M_impl.super__Vector_impl_data._M_start; pUVar24 != pUVar3;
                pUVar24 = pUVar24 + 1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f8,"proxy",(allocator<char> *)&local_118);
              pUVar10 = UniValue::operator[](pUVar24,(string *)&local_f8);
              std::__cxx11::string::string((string *)&rh_1,&pUVar10->val);
              std::__cxx11::string::~string((string *)&local_f8);
              if (local_d0 != 0) {
                iVar15 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                 *)&walletPass,(key_type *)&rh_1);
                args_00 = (_Rb_tree_node_base *)&walletPass._M_string_length;
                if (iVar15._M_node == args_00) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&ordered_proxies,(key_type *)&rh_1);
                }
                this_00 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                        *)&walletPass,(key_type *)&rh_1);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f8,"name",(allocator<char> *)&local_118);
                pUVar10 = UniValue::operator[](pUVar24,(string *)&local_f8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(this_00,&pUVar10->val);
                std::__cxx11::string::~string((string *)&local_f8);
              }
              std::__cxx11::string::~string((string *)&rh_1);
            }
            formatted_proxies.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            formatted_proxies.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            formatted_proxies.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::reserve(&formatted_proxies,
                      (long)ordered_proxies.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)ordered_proxies.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
            pbVar23 = ordered_proxies.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar20 = ordered_proxies.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar23;
                pbVar20 = pbVar20 + 1) {
              iVar15 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)&walletPass,pbVar20);
              util::
              Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
                        (&local_f8,(util *)(iVar15._M_node + 2),", ");
              args_00 = &local_f8;
              tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)&rh_1,(tinyformat *)"%s (%s)",(char *)pbVar20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_f8,pbVar22);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &formatted_proxies,(string *)&rh_1);
              std::__cxx11::string::~string((string *)&rh_1);
              std::__cxx11::string::~string((string *)&local_f8);
            }
            if (formatted_proxies.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                formatted_proxies.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f8,"n/a",(allocator<char> *)((long)&uStack_488 + 7));
            }
            else {
              util::
              Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
                        (&local_f8,(util *)&formatted_proxies,", ");
            }
            tinyformat::format<std::__cxx11::string>
                      ((string *)&rh_1,(tinyformat *)"Proxies: %s\n",(char *)&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh_1);
            std::__cxx11::string::~string((string *)&rh_1);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,"relayfee",(allocator<char> *)&local_118);
            pUVar10 = UniValue::operator[](&result,(string *)&local_f8);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)&rh_1,(tinyformat *)"Min tx relay fee rate (%s/kvB): %s\n\n",
                       (char *)&CURRENCY_UNIT_abi_cxx11_,&pUVar10->val,pbVar22);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh_1);
            std::__cxx11::string::~string((string *)&rh_1);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rh_1,"has_wallet",(allocator<char> *)&local_f8);
            pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
            VVar1 = pUVar10->typ;
            std::__cxx11::string::~string((string *)&rh_1);
            if (VVar1 != VNULL) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f8,"walletname",(allocator<char> *)&local_118);
              pUVar10 = UniValue::operator[](&result,(string *)&local_f8);
              std::__cxx11::string::string((string *)&rh_1,&pUVar10->val);
              std::__cxx11::string::~string((string *)&local_f8);
              if (local_d0 == 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_118,"\"\"",(allocator<char> *)((long)&uStack_488 + 6));
              }
              else {
                std::__cxx11::string::string
                          ((string *)&local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rh_1);
              }
              args_01 = &local_118;
              pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &_no_echo;
              tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((string *)&local_f8,(tinyformat *)"%sWallet: %s%s\n",(char *)&MAGENTA,
                         args_01,pbVar22,pbVar19);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&result_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8)
              ;
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_118,"keypoolsize",(allocator<char> *)&max_balance_length);
              pUVar10 = UniValue::operator[](&result,&local_118);
              tinyformat::format<std::__cxx11::string>
                        ((string *)&local_f8,(tinyformat *)"Keypool size: %s\n",
                         (char *)&pUVar10->val,args_01);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&result_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8)
              ;
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f8,"unlocked_until",(allocator<char> *)&local_118);
              pUVar10 = UniValue::operator[](&result,(string *)&local_f8);
              VVar1 = pUVar10->typ;
              std::__cxx11::string::~string((string *)&local_f8);
              if (VVar1 != VNULL) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_118,"unlocked_until",
                           (allocator<char> *)&max_balance_length);
                pUVar10 = UniValue::operator[](&result,&local_118);
                tinyformat::format<std::__cxx11::string>
                          ((string *)&local_f8,(tinyformat *)"Unlocked until: %s\n",
                           (char *)&pUVar10->val,args_01);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&result_string,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f8);
                std::__cxx11::string::~string((string *)&local_f8);
                std::__cxx11::string::~string((string *)&local_118);
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_118,"paytxfee",(allocator<char> *)&max_balance_length);
              pUVar10 = UniValue::operator[](&result,&local_118);
              tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)&local_f8,
                         (tinyformat *)"Transaction fee rate (-paytxfee) (%s/kvB): %s\n\n",
                         (char *)&CURRENCY_UNIT_abi_cxx11_,&pUVar10->val,pbVar22);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&result_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8)
              ;
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&rh_1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rh_1,"balance",(allocator<char> *)&local_f8);
            pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
            VVar1 = pUVar10->typ;
            std::__cxx11::string::~string((string *)&rh_1);
            if (VVar1 != VNULL) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f8,"balance",(allocator<char> *)&local_118);
              pUVar10 = UniValue::operator[](&result,(string *)&local_f8);
              pbVar22 = &pUVar10->val;
              tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((string *)&rh_1,(tinyformat *)"%sBalance:%s %s\n\n",(char *)&CYAN,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &_no_echo,pbVar22,pbVar19);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&result_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh_1);
              std::__cxx11::string::~string((string *)&rh_1);
              std::__cxx11::string::~string((string *)&local_f8);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rh_1,"balances",(allocator<char> *)&local_f8);
            pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
            VVar1 = pUVar10->typ;
            std::__cxx11::string::~string((string *)&rh_1);
            if (VVar1 != VNULL) {
              tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)&rh_1,(tinyformat *)"%sBalances%s\n",(char *)&CYAN,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &_no_echo,pbVar22);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&result_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh_1);
              std::__cxx11::string::~string((string *)&rh_1);
              max_balance_length = 10;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&rh_1,"balances",(allocator<char> *)&local_f8);
              pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
              pvVar16 = UniValue::getKeys_abi_cxx11_(pUVar10);
              std::__cxx11::string::~string((string *)&rh_1);
              pbVar20 = (pvVar16->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar23 = (pvVar16->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar20;
                  pbVar23 = pbVar23 + 1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&rh_1,"balances",(allocator<char> *)&local_f8);
                pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
                pUVar10 = UniValue::operator[](pUVar10,pbVar23);
                uVar17 = (pUVar10->val)._M_string_length;
                if (uVar17 <= max_balance_length) {
                  uVar17 = max_balance_length;
                }
                max_balance_length = uVar17;
                std::__cxx11::string::~string((string *)&rh_1);
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&rh_1,"balances",(allocator<char> *)&local_f8);
              pUVar10 = UniValue::operator[](&result,(string *)&rh_1);
              pvVar16 = UniValue::getKeys_abi_cxx11_(pUVar10);
              std::__cxx11::string::~string((string *)&rh_1);
              in_stack_fffffffffffffb48 =
                   (pointer)(pvVar16->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
              for (pUVar24 = (pointer)(pvVar16->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start;
                  pUVar24 != in_stack_fffffffffffffb48;
                  pUVar24 = (pointer)((pUVar24->val).field_2._M_local_buf + 8)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f8,"balances",(allocator<char> *)((long)&uStack_488 + 5)
                          );
                pUVar10 = UniValue::operator[](&result,(string *)&local_f8);
                pUVar10 = UniValue::operator[](pUVar10,(string *)pUVar24);
                if ((pUVar24->val)._M_dataplus._M_p == (pointer)0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_118,"\"\"",(allocator<char> *)((long)&uStack_488 + 4))
                  ;
                }
                else {
                  std::__cxx11::string::string
                            ((string *)&local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pUVar24);
                }
                tinyformat::format<unsigned_long,std::__cxx11::string,std::__cxx11::string>
                          ((string *)&rh_1,(tinyformat *)"%*s %s\n",(char *)&max_balance_length,
                           (unsigned_long *)&pUVar10->val,&local_118,pbVar19);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&result_string,(string *)&rh_1);
                std::__cxx11::string::~string((string *)&rh_1);
                std::__cxx11::string::~string((string *)&local_118);
                std::__cxx11::string::~string((string *)&local_f8);
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&result_string,"\n");
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f8,"warnings",(allocator<char> *)&local_118);
            pUVar10 = UniValue::operator[](&result,(string *)&local_f8);
            std::__cxx11::string::string((string *)&rh_1,&pUVar10->val);
            std::__cxx11::string::~string((string *)&local_f8);
            if (local_d0 == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_118,"(none)",(allocator<char> *)&max_balance_length);
            }
            else {
              std::__cxx11::string::string
                        ((string *)&local_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rh_1)
              ;
            }
            tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      ((string *)&local_f8,(tinyformat *)"%sWarnings:%s %s",(char *)&YELLOW,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &_no_echo,&local_118,pbVar19);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&result_string,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::string((string *)&local_f8,&result_string);
            str_00._M_string_length = (size_type)this;
            str_00._M_dataplus._M_p = (pointer)args_1;
            str_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb48;
            str_00.field_2._8_8_ = dVar25;
            UniValue::setStr(&result,str_00);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&rh_1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&formatted_proxies);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&ordered_proxies);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)&walletPass);
            std::__cxx11::string::~string((string *)&ibd_progress_bar);
            std::__cxx11::string::~string((string *)&result_string);
            std::__cxx11::string::~string((string *)&CYAN);
            std::__cxx11::string::~string((string *)&MAGENTA);
            std::__cxx11::string::~string((string *)&YELLOW);
            std::__cxx11::string::~string((string *)&BLUE);
            std::__cxx11::string::~string((string *)&_no_echo_1);
            std::__cxx11::string::~string((string *)&_no_echo);
          }
        }
        if (result.typ != VNULL) {
          if (result.typ == VSTR) {
            psVar12 = UniValue::get_str_abi_cxx11_(&result);
            std::__cxx11::string::string((string *)&walletPass,psVar12);
          }
          else {
            UniValue::write_abi_cxx11_((UniValue *)&walletPass,(int)&result,(void *)0x2,0);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&strPrint,&walletPass);
          std::__cxx11::string::~string((string *)&walletPass);
        }
      }
      else {
        ParseError(pUVar10,&strPrint,&local_48c);
      }
      UniValue::~UniValue(&result);
      UniValue::~UniValue((UniValue *)&rh);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&wallet_name_1);
    }
    std::__cxx11::string::~string((string *)&method);
    if (this != (NetinfoRequestHandler *)0x0) {
      (*(this->super_BaseRequestHandler)._vptr_BaseRequestHandler[1])();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
    std::__cxx11::string::~string((string *)&rpcPass);
    iVar7 = local_48c;
    bVar6 = std::operator==(&strPrint,"");
    if (!bVar6) {
      if (iVar7 == 0) {
        out = (ostream *)&std::cout;
      }
      else {
        out = (ostream *)&std::cerr;
      }
      tinyformat::format<std::__cxx11::string>(out,"%s\n",&strPrint);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&walletPass,"-netinfo",(allocator<char> *)&_no_echo);
    bVar6 = ArgsManager::GetBoolArg(&gArgs,&walletPass,false);
    std::__cxx11::string::~string((string *)&walletPass);
    if (!bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&walletPass,"-generate",(allocator<char> *)&_no_echo);
      bVar6 = ArgsManager::GetBoolArg(&gArgs,&walletPass,false);
      std::__cxx11::string::~string((string *)&walletPass);
      if (bVar6) {
        local_1c0[1]._M_local_buf[0] = false;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&_no_echo_1,"-rpcwallet",(allocator<char> *)&BLUE);
        bVar6 = ArgsManager::IsArgSet(&gArgs,(string *)&_no_echo_1);
        std::__cxx11::string::~string((string *)&_no_echo_1);
        if (bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&BLUE,"-rpcwallet",(allocator<char> *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&rh,"",(allocator<char> *)&YELLOW);
          ArgsManager::GetArg((string *)&_no_echo_1,&gArgs,&BLUE,(string *)&rh);
          std::optional<std::__cxx11::string>::operator=
                    ((optional<std::__cxx11::string> *)&_no_echo,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_no_echo_1);
          std::__cxx11::string::~string((string *)&_no_echo_1);
          std::__cxx11::string::~string((string *)&rh);
          std::__cxx11::string::~string((string *)&BLUE);
        }
        rh.super_BaseRequestHandler._vptr_BaseRequestHandler =
             (BaseRequestHandler)&PTR__BaseRequestHandler_001d48c8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&_no_echo_1,"getnewaddress",(allocator<char> *)&result);
        BLUE._M_dataplus._M_p = (pointer)0x0;
        BLUE._M_string_length = 0;
        BLUE.field_2._M_allocated_capacity = 0;
        ConnectAndCallRPC((UniValue *)&walletPass,&rh.super_BaseRequestHandler,(string *)&_no_echo_1
                          ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&BLUE,
                          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&_no_echo);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&BLUE);
        std::__cxx11::string::~string((string *)&_no_echo_1);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_no_echo);
        key_01._M_str = "error";
        key_01._M_len = 5;
        pUVar10 = UniValue::find_value((UniValue *)&walletPass,key_01);
        if (pUVar10->typ == VNULL) {
          key_02._M_str = "result";
          key_02._M_len = 6;
          pUVar10 = UniValue::find_value((UniValue *)&walletPass,key_02);
          psVar12 = UniValue::get_str_abi_cxx11_(pUVar10);
          if (0x40 < (ulong)((long)args.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)args.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar18,"too many arguments (maximum 2 for nblocks and maxtries)");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0011737b;
          }
          if (args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                       &DEFAULT_NBLOCKS_abi_cxx11_);
          }
          else {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&args,0);
            bVar6 = std::operator==(pvVar9,"0");
            if (bVar6) {
              prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &_no_echo_1,
                             "the first argument (number of blocks to generate, default: ",
                             &DEFAULT_NBLOCKS_abi_cxx11_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &_no_echo,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &_no_echo_1,") must be an integer value greater than zero");
              std::runtime_error::runtime_error(prVar18,(string *)&_no_echo);
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_0011737b;
            }
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_emplace_aux<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                     args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,psVar12);
          this = (NetinfoRequestHandler *)operator_new(0x28);
          paVar5 = (this->m_counts)._M_elems;
          paVar5[1]._M_elems[4] = 0;
          paVar5[1]._M_elems[5] = 0;
          paVar5[1]._M_elems[6] = 0;
          paVar5[1]._M_elems[7] = 0;
          paVar4 = &this->m_counts;
          paVar4->_M_elems[0]._M_elems[4] = 0;
          paVar4->_M_elems[0]._M_elems[5] = 0;
          paVar4->_M_elems[0]._M_elems[6] = 0;
          paVar4->_M_elems[0]._M_elems[7] = 0;
          paVar4 = &this->m_counts;
          paVar4->_M_elems[1]._M_elems[0] = 0;
          paVar4->_M_elems[1]._M_elems[1] = 0;
          paVar4->_M_elems[1]._M_elems[2] = 0;
          paVar4->_M_elems[1]._M_elems[3] = 0;
          (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
               (_func_int **)&PTR__GenerateToAddressRequestHandler_001d4838;
          *(array<unsigned_short,_8UL> **)(this->m_counts)._M_elems[0]._M_elems =
               (this->m_counts)._M_elems + 1;
          *(undefined1 *)(this->m_counts)._M_elems[1]._M_elems = 0;
        }
        else {
          ParseError(pUVar10,&strPrint,&local_48c);
          this = (NetinfoRequestHandler *)0x0;
        }
        UniValue::~UniValue((UniValue *)&walletPass);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&walletPass,"-addrinfo",(allocator<char> *)&_no_echo);
        bVar6 = ArgsManager::GetBoolArg(&gArgs,&walletPass,false);
        std::__cxx11::string::~string((string *)&walletPass);
        if (bVar6) {
          this = (NetinfoRequestHandler *)operator_new(8);
          (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
               (_func_int **)&PTR__BaseRequestHandler_001d4880;
        }
        else {
          this = (NetinfoRequestHandler *)operator_new(8);
          (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
               (_func_int **)&PTR__BaseRequestHandler_001d48c8;
          if (args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar18,"too few parameters (need at least command)");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0011737b;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&method,args.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&args,(const_iterator)
                        args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      goto LAB_00114a7e;
    }
    if (args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00114809:
      this = (NetinfoRequestHandler *)operator_new(0xa0);
      memset(this,0,0xa0);
      NetinfoRequestHandler::NetinfoRequestHandler(this);
      goto LAB_00114a7e;
    }
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&args,0);
    bVar6 = std::operator==(pvVar9,"help");
    if (!bVar6) goto LAB_00114809;
    memset((NetinfoRequestHandler *)&walletPass,0,0xa0);
    NetinfoRequestHandler::NetinfoRequestHandler((NetinfoRequestHandler *)&walletPass);
    tinyformat::format<std::__cxx11::string>((ostream *)&std::cout,"%s\n",&local_328);
    NetinfoRequestHandler::~NetinfoRequestHandler((NetinfoRequestHandler *)&walletPass);
    std::__cxx11::string::~string((string *)&method);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
    std::__cxx11::string::~string((string *)&rpcPass);
    iVar7 = 0;
  }
  std::__cxx11::string::~string((string *)&strPrint);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar7;
  }
LAB_0011737b:
  __stack_chk_fail();
}

Assistant:

static int CommandLineRPC(int argc, char *argv[])
{
    std::string strPrint;
    int nRet = 0;
    try {
        // Skip switches
        while (argc > 1 && IsSwitchChar(argv[1][0])) {
            argc--;
            argv++;
        }
        std::string rpcPass;
        if (gArgs.GetBoolArg("-stdinrpcpass", false)) {
            NO_STDIN_ECHO();
            if (!StdinReady()) {
                fputs("RPC password> ", stderr);
                fflush(stderr);
            }
            if (!std::getline(std::cin, rpcPass)) {
                throw std::runtime_error("-stdinrpcpass specified but failed to read from standard input");
            }
            if (StdinTerminal()) {
                fputc('\n', stdout);
            }
            gArgs.ForceSetArg("-rpcpassword", rpcPass);
        }
        std::vector<std::string> args = std::vector<std::string>(&argv[1], &argv[argc]);
        if (gArgs.GetBoolArg("-stdinwalletpassphrase", false)) {
            NO_STDIN_ECHO();
            std::string walletPass;
            if (args.size() < 1 || args[0].substr(0, 16) != "walletpassphrase") {
                throw std::runtime_error("-stdinwalletpassphrase is only applicable for walletpassphrase(change)");
            }
            if (!StdinReady()) {
                fputs("Wallet passphrase> ", stderr);
                fflush(stderr);
            }
            if (!std::getline(std::cin, walletPass)) {
                throw std::runtime_error("-stdinwalletpassphrase specified but failed to read from standard input");
            }
            if (StdinTerminal()) {
                fputc('\n', stdout);
            }
            args.insert(args.begin() + 1, walletPass);
        }
        if (gArgs.GetBoolArg("-stdin", false)) {
            // Read one arg per line from stdin and append
            std::string line;
            while (std::getline(std::cin, line)) {
                args.push_back(line);
            }
            if (StdinTerminal()) {
                fputc('\n', stdout);
            }
        }
        gArgs.CheckMultipleCLIArgs();
        std::unique_ptr<BaseRequestHandler> rh;
        std::string method;
        if (gArgs.IsArgSet("-getinfo")) {
            rh.reset(new GetinfoRequestHandler());
        } else if (gArgs.GetBoolArg("-netinfo", false)) {
            if (!args.empty() && args.at(0) == "help") {
                tfm::format(std::cout, "%s\n", NetinfoRequestHandler().m_help_doc);
                return 0;
            }
            rh.reset(new NetinfoRequestHandler());
        } else if (gArgs.GetBoolArg("-generate", false)) {
            const UniValue getnewaddress{GetNewAddress()};
            const UniValue& error{getnewaddress.find_value("error")};
            if (error.isNull()) {
                SetGenerateToAddressArgs(getnewaddress.find_value("result").get_str(), args);
                rh.reset(new GenerateToAddressRequestHandler());
            } else {
                ParseError(error, strPrint, nRet);
            }
        } else if (gArgs.GetBoolArg("-addrinfo", false)) {
            rh.reset(new AddrinfoRequestHandler());
        } else {
            rh.reset(new DefaultRequestHandler());
            if (args.size() < 1) {
                throw std::runtime_error("too few parameters (need at least command)");
            }
            method = args[0];
            args.erase(args.begin()); // Remove trailing method name from arguments vector
        }
        if (nRet == 0) {
            // Perform RPC call
            std::optional<std::string> wallet_name{};
            if (gArgs.IsArgSet("-rpcwallet")) wallet_name = gArgs.GetArg("-rpcwallet", "");
            const UniValue reply = ConnectAndCallRPC(rh.get(), method, args, wallet_name);

            // Parse reply
            UniValue result = reply.find_value("result");
            const UniValue& error = reply.find_value("error");
            if (error.isNull()) {
                if (gArgs.GetBoolArg("-getinfo", false)) {
                    if (!gArgs.IsArgSet("-rpcwallet")) {
                        GetWalletBalances(result); // fetch multiwallet balances and append to result
                    }
                    ParseGetInfoResult(result);
                }

                ParseResult(result, strPrint);
            } else {
                ParseError(error, strPrint, nRet);
            }
        }
    } catch (const std::exception& e) {
        strPrint = std::string("error: ") + e.what();
        nRet = EXIT_FAILURE;
    } catch (...) {
        PrintExceptionContinue(nullptr, "CommandLineRPC()");
        throw;
    }

    if (strPrint != "") {
        tfm::format(nRet == 0 ? std::cout : std::cerr, "%s\n", strPrint);
    }
    return nRet;
}